

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void xc_bspline(int i,int p,double u,int nderiv,double *U,double *ders)

{
  bool bVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double temp_1;
  double Ur_1;
  double Ul_1;
  int j_3;
  double saved_1;
  int jj;
  int j_2;
  int k_1;
  int maxk;
  double ND [5];
  double temp;
  double Ur;
  double Ul;
  int j_1;
  double saved;
  int k;
  int j;
  double N [8] [8];
  double local_2f0;
  int local_2e4;
  double local_2e0;
  double local_2d0;
  int local_2a4;
  double local_2a0;
  int local_298;
  int local_294;
  int local_290;
  double local_288 [6];
  double local_258;
  double local_250;
  double local_248;
  int local_23c;
  double local_238;
  int local_230;
  int local_22c;
  double local_228 [64];
  double *local_28;
  long local_20;
  int local_14;
  double local_10;
  int local_8;
  int local_4;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_XMM0_Qa;
  local_8 = in_ESI;
  local_4 = in_EDI;
  memset(in_R8,0,(long)(in_EDX + 1) << 3);
  if ((*(double *)(local_20 + (long)local_4 * 8) <= local_10) &&
     (local_10 < *(double *)(local_20 + (long)(local_4 + local_8 + 1) * 8))) {
    memset(local_228,0,0x200);
    for (local_22c = 0; local_22c <= local_8; local_22c = local_22c + 1) {
      bVar1 = false;
      if (*(double *)(local_20 + (long)(local_4 + local_22c) * 8) <= local_10) {
        bVar1 = local_10 < *(double *)(local_20 + (long)(local_4 + local_22c + 1) * 8);
      }
      local_2d0 = 1.0;
      if (!bVar1) {
        local_2d0 = 0.0;
      }
      local_228[local_22c] = local_2d0;
    }
    for (local_230 = 1; local_230 <= local_8; local_230 = local_230 + 1) {
      if ((local_228[(long)(local_230 + -1) * 8] != 0.0) ||
         (NAN(local_228[(long)(local_230 + -1) * 8]))) {
        local_2e0 = ((local_10 - *(double *)(local_20 + (long)local_4 * 8)) *
                    local_228[(long)(local_230 + -1) * 8]) /
                    (*(double *)(local_20 + (long)(local_4 + local_230) * 8) -
                    *(double *)(local_20 + (long)local_4 * 8));
      }
      else {
        local_2e0 = 0.0;
      }
      local_238 = local_2e0;
      for (local_23c = 0; local_23c <= local_8 - local_230; local_23c = local_23c + 1) {
        local_248 = *(double *)(local_20 + (long)(local_4 + local_23c + 1) * 8);
        local_250 = *(double *)(local_20 + (long)(local_4 + local_23c + local_230 + 1) * 8);
        if ((local_228[(long)(local_230 + -1) * 8 + (long)(local_23c + 1)] != 0.0) ||
           (NAN(local_228[(long)(local_230 + -1) * 8 + (long)(local_23c + 1)]))) {
          local_258 = local_228[(long)(local_230 + -1) * 8 + (long)(local_23c + 1)] /
                      (local_250 - local_248);
          local_228[(long)local_230 * 8 + (long)local_23c] =
               (local_250 - local_10) * local_258 + local_238;
          local_238 = (local_10 - local_248) * local_258;
        }
        else {
          local_228[(long)local_230 * 8 + (long)local_23c] = local_238;
          local_238 = 0.0;
        }
      }
    }
    *local_28 = local_228[(long)local_8 * 8];
    if (local_14 != 0) {
      if (local_14 < local_8) {
        local_2e4 = local_14;
      }
      else {
        local_2e4 = local_8;
      }
      for (local_290 = 1; local_290 <= local_2e4; local_290 = local_290 + 1) {
        memset(local_288,0,(long)(local_14 + 1) << 3);
        for (local_294 = 0; local_294 <= local_290; local_294 = local_294 + 1) {
          local_288[local_294] = local_228[(long)(local_8 - local_290) * 8 + (long)local_294];
        }
        for (local_298 = 1; local_298 <= local_290; local_298 = local_298 + 1) {
          if ((local_288[0] != 0.0) || (NAN(local_288[0]))) {
            local_2f0 = local_288[0] /
                        (*(double *)
                          (local_20 + (long)(((local_4 + local_8) - local_290) + local_298) * 8) -
                        *(double *)(local_20 + (long)local_4 * 8));
          }
          else {
            local_2f0 = 0.0;
          }
          local_2a0 = local_2f0;
          for (local_2a4 = 0; local_2a4 <= local_290 - local_298; local_2a4 = local_2a4 + 1) {
            if ((local_288[local_2a4 + 1] != 0.0) || (NAN(local_288[local_2a4 + 1]))) {
              dVar2 = local_288[local_2a4 + 1] /
                      (*(double *)
                        (local_20 +
                        (long)(((local_4 + local_2a4 + local_8) - local_290) + local_298 + 1) * 8) -
                      *(double *)(local_20 + (long)(local_4 + local_2a4 + 1) * 8));
              local_288[local_2a4] =
                   (double)((local_8 - local_290) + local_298) * (local_2a0 - dVar2);
              local_2a0 = dVar2;
            }
            else {
              local_288[local_2a4] = (double)((local_8 - local_290) + local_298) * local_2a0;
              local_2a0 = 0.0;
            }
          }
        }
        local_28[local_290] = local_288[0];
      }
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
xc_bspline(int i, int p, double u, int nderiv, const double *U, double *ders) {

  /* Initialize output array */
  libxc_memset(ders, 0, (nderiv+1)*sizeof(double));

  /* Check locality of support */
  if(u < U[i] || u >= U[i+p+1]) {
    return;
  }

  /* Arrays need static sizes for stack allocation */
#define PMAX 8
  assert(p<PMAX);

  /* Array of normalized B splines, use dense storage for simpler code */
  double N[PMAX][PMAX];
  libxc_memset(N, 0, PMAX*PMAX*sizeof(double));

  /* Initialize zeroth-degree functions: piecewise constants */
  for(int j=0; j<=p; j++) {
    N[0][j] = (u >= U[i+j] && u < U[i+j+1]) ? 1.0 : 0.0;
  }

  /* Fill out table of B splines */
  for(int k=1; k<=p; k++) {
    double saved = (N[k-1][0] == 0.0) ? 0.0 : ((u-U[i])*N[k-1][0])/(U[i+k]-U[i]);

    for(int j=0; j<=p-k; j++) {
      double Ul = U[i+j+1];
      double Ur = U[i+j+k+1];
      if(N[k-1][j+1] == 0.0) {
        N[k][j] = saved;
        saved = 0.0;
      } else {
        double temp = N[k-1][j+1] / (Ur-Ul);
        N[k][j] = saved + (Ur-u)*temp;
        saved = (u-Ul)*temp;
      }
    }
  }

  /* Function value */
  ders[0] = N[p][0];
  if(nderiv==0)
    return;

  /* Helper memory */
  assert(nderiv<=4);
  double ND[5]; /* dimension nderiv+1 */
  int maxk = (nderiv < p) ? nderiv : p;

  /* Compute derivatives */
  for(int k=1; k<=maxk; k++) {
    /* Load appropriate column */
    libxc_memset(ND, 0, (nderiv+1)*sizeof(double));
    for(int j=0; j<=k; j++)
      ND[j] = N[p-k][j];

    /* Compute table */
    for(int jj=1; jj<=k; jj++) {
      double saved = (ND[0] == 0.0) ? 0.0 : ND[0]/(U[i+p-k+jj]-U[i]);

      for(int j=0; j<=k-jj; j++) {
        double Ul = U[i+j+1];
        /* the -k term is missing in the book */
        double Ur = U[i+j+p-k+jj+1];
        if(ND[j+1] == 0.0) {
          ND[j] = (p-k+jj)*saved;
          saved = 0.0;
        } else {
          double temp = ND[j+1]/(Ur-Ul);
          ND[j] = (p-k+jj)*(saved-temp);
          saved = temp;
        }
      }
    }
    /* k:th derivative is */
    ders[k] = ND[0];
  }
}